

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

diyfp nlohmann::detail::dtoa_impl::diyfp::mul(diyfp *x,diyfp *y)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  diyfp dVar7;
  
  uVar2 = x->f & 0xffffffff;
  uVar1 = x->f >> 0x20;
  uVar4 = y->f & 0xffffffff;
  uVar6 = y->f >> 0x20;
  uVar3 = uVar2 * uVar6;
  uVar5 = uVar4 * uVar1;
  dVar7.f = ((uVar5 & 0xffffffff) + (uVar3 & 0xffffffff) + (uVar4 * uVar2 >> 0x20) + 0x80000000 >>
            0x20) + (uVar5 >> 0x20) + uVar6 * uVar1 + (uVar3 >> 0x20);
  dVar7.e = y->e + x->e + 0x40;
  dVar7._12_4_ = 0;
  return dVar7;
}

Assistant:

static diyfp mul(const diyfp& x, const diyfp& y) noexcept
                {
                    static_assert(kPrecision == 64, "internal error");

                    // Computes:
                    //  f = round((x.f * y.f) / 2^q)
                    //  e = x.e + y.e + q

                    // Emulate the 64-bit * 64-bit multiplication:
                    //
                    // p = u * v
                    //   = (u_lo + 2^32 u_hi) (v_lo + 2^32 v_hi)
                    //   = (u_lo v_lo         ) + 2^32 ((u_lo v_hi         ) + (u_hi v_lo         )) + 2^64 (u_hi v_hi         )
                    //   = (p0                ) + 2^32 ((p1                ) + (p2                )) + 2^64 (p3                )
                    //   = (p0_lo + 2^32 p0_hi) + 2^32 ((p1_lo + 2^32 p1_hi) + (p2_lo + 2^32 p2_hi)) + 2^64 (p3                )
                    //   = (p0_lo             ) + 2^32 (p0_hi + p1_lo + p2_lo                      ) + 2^64 (p1_hi + p2_hi + p3)
                    //   = (p0_lo             ) + 2^32 (Q                                          ) + 2^64 (H                 )
                    //   = (p0_lo             ) + 2^32 (Q_lo + 2^32 Q_hi                           ) + 2^64 (H                 )
                    //
                    // (Since Q might be larger than 2^32 - 1)
                    //
                    //   = (p0_lo + 2^32 Q_lo) + 2^64 (Q_hi + H)
                    //
                    // (Q_hi + H does not overflow a 64-bit int)
                    //
                    //   = p_lo + 2^64 p_hi

                    const std::uint64_t u_lo = x.f & 0xFFFFFFFFu;
                    const std::uint64_t u_hi = x.f >> 32u;
                    const std::uint64_t v_lo = y.f & 0xFFFFFFFFu;
                    const std::uint64_t v_hi = y.f >> 32u;

                    const std::uint64_t p0 = u_lo * v_lo;
                    const std::uint64_t p1 = u_lo * v_hi;
                    const std::uint64_t p2 = u_hi * v_lo;
                    const std::uint64_t p3 = u_hi * v_hi;

                    const std::uint64_t p0_hi = p0 >> 32u;
                    const std::uint64_t p1_lo = p1 & 0xFFFFFFFFu;
                    const std::uint64_t p1_hi = p1 >> 32u;
                    const std::uint64_t p2_lo = p2 & 0xFFFFFFFFu;
                    const std::uint64_t p2_hi = p2 >> 32u;

                    std::uint64_t Q = p0_hi + p1_lo + p2_lo;

                    // The full product might now be computed as
                    //
                    // p_hi = p3 + p2_hi + p1_hi + (Q >> 32)
                    // p_lo = p0_lo + (Q << 32)
                    //
                    // But in this particular case here, the full p_lo is not required.
                    // Effectively we only need to add the highest bit in p_lo to p_hi (and
                    // Q_hi + 1 does not overflow).

                    Q += std::uint64_t{ 1 } << (64u - 32u - 1u); // round, ties up

                    const std::uint64_t h = p3 + p2_hi + p1_hi + (Q >> 32u);

                    return { h, x.e + y.e + 64 };
                }